

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O1

char * vrna_dirname(char *path)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (path == (char *)0x0) {
LAB_0012cb9b:
    __s = (char *)0x0;
  }
  else {
    if (*path == '/') {
      __s = strdup(path);
    }
    else {
      __s = vrna_strdup_printf(".%c%s",0x2f);
    }
    sVar1 = strlen(__s);
    pcVar3 = __s + (int)sVar1;
    do {
      pcVar2 = pcVar3 + -1;
      *pcVar3 = '\0';
      if (pcVar2 <= __s) goto LAB_0012cb9b;
      pcVar3 = pcVar2;
    } while (*pcVar2 != '/');
  }
  return __s;
}

Assistant:

PUBLIC char *
vrna_dirname(const char *path)
{
  char  *name, *p, *ptr;
  int   pos;

  name = NULL;

  if (path) {
    if (!is_absolute_path(path))
      ptr = vrna_strdup_printf(".%c%s", DIRSEPC, path);
    else
      ptr = strdup(path);

    pos = (int)strlen(ptr);
    p   = ptr + pos;

    do  /* remove part after last separator */
      *p = '\0';
    while ((--p > ptr) && (*p != DIRSEPC));

    if (p > ptr)
      name = ptr;
  }

  return name;
}